

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robust_statistics.h
# Opt level: O2

void highwayhash::CountingSort<unsigned_int>(uint *begin,uint *end)

{
  int iVar1;
  uint uVar2;
  pair<unsigned_int,_int> *value_count;
  __normal_iterator<std::pair<unsigned_int,_int>_*,_std::vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>_>
  _Var3;
  pointer ppVar4;
  vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_> *__range2;
  long lVar5;
  uint *p;
  uint *puVar6;
  vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_> unique;
  pair<unsigned_int,_int> local_30;
  
  unique.
  super__Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  unique.
  super__Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  unique.
  super__Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (puVar6 = begin; puVar6 != end; puVar6 = puVar6 + 1) {
    _Var3 = std::
            __find_if<__gnu_cxx::__normal_iterator<std::pair<unsigned_int,int>*,std::vector<std::pair<unsigned_int,int>,std::allocator<std::pair<unsigned_int,int>>>>,__gnu_cxx::__ops::_Iter_pred<highwayhash::CountingSort<unsigned_int>(unsigned_int*,unsigned_int*)::_lambda(std::pair<unsigned_int,int>const&)_1_>>
                      (unique.
                       super__Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       unique.
                       super__Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,*puVar6);
    if (_Var3._M_current ==
        unique.
        super__Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_30 = (pair<unsigned_int,_int>)((ulong)*puVar6 | 0x100000000);
      std::vector<std::pair<unsigned_int,int>,std::allocator<std::pair<unsigned_int,int>>>::
      emplace_back<std::pair<unsigned_int,int>>
                ((vector<std::pair<unsigned_int,int>,std::allocator<std::pair<unsigned_int,int>>> *)
                 &unique,&local_30);
    }
    else {
      (_Var3._M_current)->second = (_Var3._M_current)->second + 1;
    }
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<std::pair<unsigned_int,int>*,std::vector<std::pair<unsigned_int,int>,std::allocator<std::pair<unsigned_int,int>>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (unique.
             super__Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             unique.
             super__Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  for (ppVar4 = unique.
                super__Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppVar4 != unique.
                super__Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; ppVar4 = ppVar4 + 1) {
    iVar1 = ppVar4->second;
    uVar2 = ppVar4->first;
    for (lVar5 = 0; (long)iVar1 * 4 != lVar5; lVar5 = lVar5 + 4) {
      *(uint *)((long)begin + lVar5) = uVar2;
    }
    begin = begin + ppVar4->second;
  }
  if (begin == end) {
    std::_Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
    ::~_Vector_base(&unique.
                     super__Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
                   );
    return;
  }
  __assert_fail("p == end",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]highwayhash/highwayhash/robust_statistics.h"
                ,0x68,"void highwayhash::CountingSort(T *, T *) [T = unsigned int]");
}

Assistant:

void CountingSort(T* begin, T* end) {
  // Unique values and their frequency (similar to flat_map).
  using Unique = std::pair<T, int>;
  std::vector<Unique> unique;
  for (const T* p = begin; p != end; ++p) {
    const T value = *p;
    const auto pos =
        std::find_if(unique.begin(), unique.end(),
                     [value](const Unique& u) { return u.first == value; });
    if (pos == unique.end()) {
      unique.push_back(std::make_pair(*p, 1));
    } else {
      ++pos->second;
    }
  }

  // Sort in ascending order of value (pair.first).
  std::sort(unique.begin(), unique.end());

  // Write that many copies of each unique value to the array.
  T* HH_RESTRICT p = begin;
  for (const auto& value_count : unique) {
    std::fill(p, p + value_count.second, value_count.first);
    p += value_count.second;
  }
  assert(p == end);
}